

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O1

GMM_STATUS __thiscall
GmmLib::GmmMultiAdapterContext::AddContext
          (GmmMultiAdapterContext *this,PLATFORM Platform,void *_pSkuTable,void *_pWaTable,
          void *_pGtSysInfo,ADAPTER_BDF sBdf,GMM_CLIENT ClientType)

{
  int iVar1;
  GMM_STATUS GVar2;
  int32_t *Ref;
  GMM_ADAPTER_INFO *pGVar3;
  Context *this_00;
  int32_t *Ref_1;
  GMM_STATUS GVar4;
  bool bVar5;
  
  if (_pGtSysInfo == (void *)0x0 || (_pWaTable == (void *)0x0 || _pSkuTable == (void *)0x0)) {
    return GMM_ERROR;
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->MAContextSyncMutex);
  for (pGVar3 = this->pHeadNode; pGVar3 != (GMM_ADAPTER_INFO *)0x0; pGVar3 = pGVar3->pNext) {
    if ((((pGVar3->pGmmLibContext->sBdf).field_0.Data ^ (uint)sBdf.field_0) & 0xffffff) == 0)
    goto LAB_001bc5a1;
  }
  pGVar3 = (GMM_ADAPTER_INFO *)0x0;
LAB_001bc5a1:
  if (pGVar3 == (GMM_ADAPTER_INFO *)0x0) {
    pGVar3 = AddAdapterNode(this);
    GVar4 = GMM_ERROR;
    if (pGVar3 != (GMM_ADAPTER_INFO *)0x0) {
      this_00 = (Context *)malloc(14000);
      if (this_00 == (Context *)0x0) {
        this_00 = (Context *)0x0;
      }
      else {
        memset(&this_00->ClientType,0,0x35e4);
        this_00->AllowedPaddingFor64KbPagesPercentage = 10;
        this_00->InternalGpuVaMax = 0;
        this_00->AllowedPaddingFor64KBTileSurf = 10;
        (this_00->SyncMutex).__align = 0;
        *(undefined8 *)((long)&this_00->SyncMutex + 8) = 0;
        *(undefined8 *)((long)&this_00->SyncMutex + 0x10) = 0;
        (this_00->SyncMutex).__data.__list.__prev = (__pthread_internal_list *)0x0;
        (this_00->SyncMutex).__data.__list.__next = (__pthread_internal_list *)0x0;
        this_00->RefCount = 0;
      }
      if (this_00 != (Context *)0x0) {
        LOCK();
        this_00->RefCount = this_00->RefCount + 1;
        UNLOCK();
        GVar2 = Context::InitContext
                          (this_00,&Platform,(SKU_FEATURE_TABLE *)_pSkuTable,(WA_TABLE *)_pWaTable,
                           (GT_SYSTEM_INFO *)_pGtSysInfo,ClientType);
        if (GVar2 == GMM_SUCCESS) {
          (this_00->sBdf).field_0.field_0 =
               (anon_struct_4_4_a1e812c5_for_anon_union_4_2_d56df3a2_for__ADAPTER_BDF__0_0)
               sBdf.field_0;
          pGVar3->pGmmLibContext = this_00;
          GVar4 = GMM_SUCCESS;
          goto LAB_001bc6b7;
        }
        do {
          iVar1 = this_00->RefCount;
          if (iVar1 < 1) break;
          LOCK();
          bVar5 = iVar1 == this_00->RefCount;
          if (bVar5) {
            this_00->RefCount = iVar1 + -1;
          }
          UNLOCK();
        } while (!bVar5);
        Context::DestroyContext(this_00);
        pthread_mutex_destroy((pthread_mutex_t *)&this_00->SyncMutex);
        free(this_00);
      }
      RemoveAdapterNode(this,pGVar3);
    }
  }
  else {
    LOCK();
    pGVar3->pGmmLibContext->RefCount = pGVar3->pGmmLibContext->RefCount + 1;
    UNLOCK();
    GVar4 = GMM_SUCCESS;
  }
LAB_001bc6b7:
  pthread_mutex_unlock((pthread_mutex_t *)&this->MAContextSyncMutex);
  return GVar4;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmMultiAdapterContext::AddContext(const PLATFORM Platform,
                                                                  const void    *_pSkuTable,
                                                                  const void    *_pWaTable,
                                                                  const void    *_pGtSysInfo,
                                                                  ADAPTER_BDF    sBdf,
                                                                  const GMM_CLIENT ClientType)
#endif
{
    __GMM_ASSERTPTR(_pSkuTable, GMM_ERROR);
    __GMM_ASSERTPTR(_pWaTable, GMM_ERROR);
    __GMM_ASSERTPTR(_pGtSysInfo, GMM_ERROR);

    GMM_STATUS                Status = GMM_SUCCESS;
    SKU_FEATURE_TABLE        *pSkuTable;
    WA_TABLE                 *pWaTable;
    GT_SYSTEM_INFO           *pSysInfo;
    GMM_LIB_CONTEXT          *pGmmLibContext = NULL;
    GmmLib::GMM_ADAPTER_INFO *pNode          = NULL;

    pSkuTable = (SKU_FEATURE_TABLE *)_pSkuTable;
    pWaTable  = (WA_TABLE *)_pWaTable;
    pSysInfo  = (GT_SYSTEM_INFO *)_pGtSysInfo;

    GMM_STATUS SyncLockStatus = LockMAContextSyncMutex();
    if (SyncLockStatus != GMM_SUCCESS)
    {
        return SyncLockStatus;
    }

    // see if a context with the given BDF already exists
    pNode = GetAdapterNodeUnlocked(sBdf);

    if (pNode)
    {
        // The requested adapter context already exists. increment the reference count.
        // No further initialization needed.
        pNode->pGmmLibContext->IncrementRefCount();
        UnLockMAContextSyncMutex();
        return GMM_SUCCESS;
    }

    // No context exists for this bdf. Add a new node to store the context.
    pNode = AddAdapterNode();
    if (pNode == NULL)
    {
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    // No context for this adapter yet, Lets create a new LibContext
    pGmmLibContext = new GMM_LIB_CONTEXT();
    if (pGmmLibContext == NULL)
    {
        RemoveAdapterNode(pNode);
        pNode = NULL;
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

    pGmmLibContext->IncrementRefCount();

    Status = (pGmmLibContext->InitContext(Platform, pSkuTable, pWaTable, pSysInfo, ClientType));
    if (Status != GMM_SUCCESS)
    {
        //clean everything and return error
        pGmmLibContext->DecrementRefCount();
        pGmmLibContext->DestroyContext();
        // Delete/free the LibContext object
        delete pGmmLibContext;
        RemoveAdapterNode(pNode);
        UnLockMAContextSyncMutex();
        return GMM_ERROR;
    }

#if LHDM
    // Initialize SingletonContext Data.
    // TBD: ProcessHeap creation requires size and GfxAddress parameters. These parameters are constants
    // and are given by GMM lib internally by PageTableMgr. Hence pHeapObj should be created here at the
    // time of SingletonContext creation. But untill all UMD clients have moved to GMM DLL, then we will
    // create this here.
    pGmmLibContext->pHeapObj           = NULL;
    pGmmLibContext->ProcessHeapCounter = 0;

    // TBD: ProcessVA Gfx partition should be created here using VirtualAlloc at the time of SingletonContext
    // creation. But untill all UMD clients have moved to GMM DLL, then we will
    // create this here.
    pGmmLibContext->ProcessVA        = {0};
    pGmmLibContext->ProcessVACounter = 0;

    pGmmLibContext->IsSVMReserved      = 0;
    pGmmLibContext->NullCCSTileAddress = 0;
#endif

    pGmmLibContext->sBdf = sBdf;

    pNode->pGmmLibContext = pGmmLibContext;


    UnLockMAContextSyncMutex();

    return GMM_SUCCESS;
}